

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm.h
# Opt level: O1

void ncnn::conv_im2col_sgemm_transform_kernel_sse
               (Mat *_kernel,Mat *kernel_tm,int inch,int outch,int kernel_size)

{
  void *pvVar1;
  void *pvVar2;
  size_t sVar3;
  size_t sVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  undefined4 *puVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  int iVar16;
  
  pvVar1 = _kernel->data;
  iVar6 = outch + 3;
  if (-1 < outch) {
    iVar6 = outch;
  }
  iVar16 = 0;
  Mat::create(kernel_tm,kernel_size * 4,inch,outch + (iVar6 >> 2) * -3,4,(Allocator *)0x0);
  if (0 < outch >> 2) {
    pvVar2 = kernel_tm->data;
    sVar3 = kernel_tm->cstep;
    sVar4 = kernel_tm->elemsize;
    iVar8 = kernel_size * inch;
    iVar10 = iVar8 * 3;
    iVar6 = iVar8 * 4;
    iVar13 = iVar8 * 2;
    uVar7 = 0;
    iVar14 = iVar8;
    do {
      if (0 < iVar8) {
        puVar9 = (undefined4 *)(sVar3 * sVar4 * uVar7 + (long)pvVar2);
        lVar15 = 0;
        do {
          *puVar9 = *(undefined4 *)((long)pvVar1 + lVar15 * 4 + (long)iVar16 * 4);
          puVar9[1] = *(undefined4 *)((long)pvVar1 + lVar15 * 4 + (long)iVar14 * 4);
          puVar9[2] = *(undefined4 *)((long)pvVar1 + lVar15 * 4 + (long)iVar13 * 4);
          puVar9[3] = *(undefined4 *)((long)pvVar1 + lVar15 * 4 + (long)iVar10 * 4);
          lVar15 = lVar15 + 1;
          puVar9 = puVar9 + 4;
        } while (iVar8 != (int)lVar15);
      }
      uVar7 = uVar7 + 1;
      iVar10 = iVar10 + iVar6;
      iVar13 = iVar13 + iVar6;
      iVar14 = iVar14 + iVar6;
      iVar16 = iVar16 + iVar6;
    } while (uVar7 != (uint)(outch >> 2));
  }
  if ((outch & 0xfffffffcU) != outch) {
    pvVar2 = kernel_tm->data;
    sVar3 = kernel_tm->cstep;
    sVar4 = kernel_tm->elemsize;
    iVar6 = kernel_size * inch;
    lVar15 = (long)(int)(outch & 0xfffffffcU);
    iVar16 = ((uint)outch >> 2) * iVar6 * 4;
    do {
      if (0 < iVar6) {
        uVar5 = (uint)lVar15;
        uVar11 = uVar5 + 3;
        if (-1 < (int)uVar5) {
          uVar11 = uVar5;
        }
        lVar12 = 0;
        do {
          *(undefined4 *)
           ((long)pvVar2 +
           lVar12 * 4 +
           (long)(int)(((int)uVar11 >> 2) + (uVar5 - (uVar11 & 0xfffffffc))) * sVar3 * sVar4) =
               *(undefined4 *)((long)pvVar1 + lVar12 * 4 + (long)iVar16 * 4);
          lVar12 = lVar12 + 1;
        } while (iVar6 != (int)lVar12);
      }
      lVar15 = lVar15 + 1;
      iVar16 = iVar16 + iVar6;
    } while (lVar15 < outch);
  }
  return;
}

Assistant:

static void conv_im2col_sgemm_transform_kernel_sse(const Mat& _kernel, Mat& kernel_tm, int inch, int outch, int kernel_size)
{
    const float* kernel = _kernel;

    // kernel memory packed 4 x 4
    kernel_tm.create(4*kernel_size, inch, outch/4 + outch%4);
    
    int nn_outch = 0;
    int remain_outch_start = 0;

    nn_outch = outch >> 2;
    remain_outch_start = nn_outch << 2;

    for (int pp=0; pp<nn_outch; pp++)
    {
        int p = pp * 4;

        const float* k0 = kernel + (p+0)*inch*kernel_size;
        const float* k1 = kernel + (p+1)*inch*kernel_size;
        const float* k2 = kernel + (p+2)*inch*kernel_size;
        const float* k3 = kernel + (p+3)*inch*kernel_size;

        float* ktmp = kernel_tm.channel(p/4);

        for (int q=0; q<inch*kernel_size; q++)
        {
            ktmp[0] = k0[0];
            ktmp[1] = k1[0];
            ktmp[2] = k2[0];
            ktmp[3] = k3[0];
            ktmp += 4;

            k0 += 1;
            k1 += 1;
            k2 += 1;
            k3 += 1;
        }
    }
    
    for (int p=remain_outch_start; p<outch; p++)
    {
        const float* k0 = kernel + (p+0)*inch*kernel_size;

        float* ktmp = kernel_tm.channel(p/4 + p%4);

        for (int q=0; q<inch*kernel_size; q++)
        {
            ktmp[0] = k0[0];
            ktmp++;
            k0++;
        }
    }
}